

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O0

void displayLimitCycleInfo
               (ostream *o,PolynomialFDS *pds,
               vector<ComponentData,_std::allocator<ComponentData>_> *cycleinfo)

{
  int numstates;
  int numvars;
  ostream *poVar1;
  size_type sVar2;
  void *pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  int local_60;
  int j;
  long cyclelen;
  long i;
  State u;
  vector<ComponentData,_std::allocator<ComponentData>_> *cycleinfo_local;
  PolynomialFDS *pds_local;
  ostream *o_local;
  
  u.mState.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)cycleinfo;
  poVar1 = std::operator<<(o,"Number of cycles (components): ");
  sVar2 = std::vector<ComponentData,_std::allocator<ComponentData>_>::size
                    ((vector<ComponentData,_std::allocator<ComponentData>_> *)
                     u.mState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,sVar2);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  numstates = PolynomialFDS::numStates(pds);
  numvars = PolynomialFDS::numVariables(pds);
  State::State((State *)&i,numstates,numvars);
  cyclelen = 0;
  while( true ) {
    sVar2 = std::vector<ComponentData,_std::allocator<ComponentData>_>::size
                      ((vector<ComponentData,_std::allocator<ComponentData>_> *)
                       u.mState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= (ulong)cyclelen) break;
    pvVar4 = std::vector<ComponentData,_std::allocator<ComponentData>_>::operator[]
                       ((vector<ComponentData,_std::allocator<ComponentData>_> *)
                        u.mState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,cyclelen);
    sVar2 = Catch::clara::std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)&pvVar4->limitCycle);
    poVar1 = std::operator<<(o,"COMPONENT #");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,cyclelen + 1);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(o,"  component size: ");
    pvVar4 = std::vector<ComponentData,_std::allocator<ComponentData>_>::operator[]
                       ((vector<ComponentData,_std::allocator<ComponentData>_> *)
                        u.mState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,cyclelen);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,pvVar4->componentSize);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    if (sVar2 == 1) {
      pvVar4 = std::vector<ComponentData,_std::allocator<ComponentData>_>::operator[]
                         ((vector<ComponentData,_std::allocator<ComponentData>_> *)
                          u.mState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,cyclelen);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](&pvVar4->limitCycle,0);
      State::setFromIndex((State *)&i,*pvVar5);
      poVar1 = std::operator<<(o,"  fixed point: [");
      poVar1 = operator<<(poVar1,(State *)&i);
      poVar1 = std::operator<<(poVar1,"]");
      pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar1 = std::operator<<(o,"  cycle of length ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
      poVar1 = std::operator<<(poVar1,": ");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      for (local_60 = 0; (long)local_60 < (long)sVar2; local_60 = local_60 + 1) {
        pvVar4 = std::vector<ComponentData,_std::allocator<ComponentData>_>::operator[]
                           ((vector<ComponentData,_std::allocator<ComponentData>_> *)
                            u.mState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,cyclelen);
        pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                           (&pvVar4->limitCycle,(long)local_60);
        State::setFromIndex((State *)&i,*pvVar5);
        poVar1 = std::operator<<(o,"    [");
        poVar1 = operator<<(poVar1,(State *)&i);
        poVar1 = std::operator<<(poVar1,"] -> ");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
      pvVar4 = std::vector<ComponentData,_std::allocator<ComponentData>_>::operator[]
                         ((vector<ComponentData,_std::allocator<ComponentData>_> *)
                          u.mState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,cyclelen);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](&pvVar4->limitCycle,0);
      State::setFromIndex((State *)&i,*pvVar5);
      poVar1 = std::operator<<(o,"    [");
      poVar1 = operator<<(poVar1,(State *)&i);
      poVar1 = std::operator<<(poVar1,"]");
      pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    cyclelen = cyclelen + 1;
  }
  State::~State((State *)&i);
  return;
}

Assistant:

void displayLimitCycleInfo(std::ostream& o,
                           const PolynomialFDS& pds,
                           const std::vector<ComponentData>& cycleinfo)
{
  o << "Number of cycles (components): " << cycleinfo.size() << std::endl << std::endl;
  State u(pds.numStates(), pds.numVariables());  
  for (long i=0; i<cycleinfo.size(); i++)
    {
      long cyclelen = cycleinfo[i].limitCycle.size();
      o << "COMPONENT #" << i+1 << ":" << std::endl;
      o << "  component size: " << cycleinfo[i].componentSize << std::endl;
      if (cyclelen == 1)
        {
          u.setFromIndex(cycleinfo[i].limitCycle[0]);
          o << "  fixed point: [" << u << "]" << std::endl << std::endl;
        }
      else {
        o << "  cycle of length " << cyclelen << ": " << std::endl;
        for (int j=0; j<cyclelen; j++)
          {
            u.setFromIndex(cycleinfo[i].limitCycle[j]);
            o << "    [" << u << "] -> " << std::endl;
          }
        u.setFromIndex(cycleinfo[i].limitCycle[0]);
        o << "    [" << u << "]" << std::endl << std::endl;
      }
    }
}